

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O1

int32_t __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::getDataBlock(MutableCodePointTrie *this,int32_t i)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if (this->flags[i] == '\x01') {
    uVar4 = this->index[i];
  }
  else if (i < 0x1000) {
    uVar4 = allocDataBlock(this,0x40);
    if (-1 < (int)uVar4) {
      uVar5 = (ulong)uVar4;
      lVar7 = uVar5 * 4;
      lVar6 = (long)(int)(i & 0xfffffffc);
      do {
        uVar1 = this->index[lVar6];
        puVar2 = this->data;
        uVar8 = 0xfffffffffffffffc;
        do {
          *(uint32_t *)((long)puVar2 + uVar8 + lVar7 + 4) = uVar1;
          uVar8 = uVar8 + 4;
        } while (uVar8 < 0x3c);
        this->flags[lVar6] = '\x01';
        puVar2 = this->index;
        puVar2[lVar6] = (uint32_t)uVar5;
        uVar5 = uVar5 + 0x10;
        lVar7 = lVar7 + 0x40;
        bVar3 = lVar6 < (int)(i | 3);
        lVar6 = lVar6 + 1;
      } while (bVar3);
      uVar4 = puVar2[i];
    }
  }
  else {
    uVar4 = allocDataBlock(this,0x10);
    if (-1 < (int)uVar4) {
      puVar2 = this->data;
      uVar1 = this->index[i];
      uVar5 = 0xfffffffffffffffc;
      do {
        *(uint32_t *)((long)puVar2 + uVar5 + (ulong)uVar4 * 4 + 4) = uVar1;
        uVar5 = uVar5 + 4;
      } while (uVar5 < 0x3c);
      this->flags[i] = '\x01';
      this->index[i] = uVar4;
    }
  }
  return uVar4;
}

Assistant:

int32_t MutableCodePointTrie::getDataBlock(int32_t i) {
    if (flags[i] == MIXED) {
        return index[i];
    }
    if (i < BMP_I_LIMIT) {
        int32_t newBlock = allocDataBlock(UCPTRIE_FAST_DATA_BLOCK_LENGTH);
        if (newBlock < 0) { return newBlock; }
        int32_t iStart = i & ~(SMALL_DATA_BLOCKS_PER_BMP_BLOCK -1);
        int32_t iLimit = iStart + SMALL_DATA_BLOCKS_PER_BMP_BLOCK;
        do {
            U_ASSERT(flags[iStart] == ALL_SAME);
            writeBlock(data + newBlock, index[iStart]);
            flags[iStart] = MIXED;
            index[iStart++] = newBlock;
            newBlock += UCPTRIE_SMALL_DATA_BLOCK_LENGTH;
        } while (iStart < iLimit);
        return index[i];
    } else {
        int32_t newBlock = allocDataBlock(UCPTRIE_SMALL_DATA_BLOCK_LENGTH);
        if (newBlock < 0) { return newBlock; }
        writeBlock(data + newBlock, index[i]);
        flags[i] = MIXED;
        index[i] = newBlock;
        return newBlock;
    }
}